

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::OutputFile::OutputFile(OutputFile *this,OStream *os,Header *header,int numThreads)

{
  Header *header_00;
  OStream *os_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  _func_int *p_Var1;
  undefined8 in_RSI;
  GenericOutputFile *in_RDI;
  bool in_stack_00000017;
  OStream *in_stack_00000018;
  Header *in_stack_00000020;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_00001a5e;
  undefined1 in_stack_00001a5f;
  Header *in_stack_00001a60;
  OutputStreamMutex *in_stack_fffffffffffffdd0;
  OStream *in_stack_fffffffffffffdd8;
  GenericOutputFile *in_stack_fffffffffffffde0;
  Data *in_stack_fffffffffffffe40;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__OutputFile_004c7fc0;
  header_00 = (Header *)operator_new(0x148);
  Data::Data(in_stack_fffffffffffffe40,(int)((ulong)header_00 >> 0x20));
  in_RDI[1]._vptr_GenericOutputFile = (_func_int **)header_00;
  os_00 = (OStream *)operator_new(0x38);
  *(undefined8 *)((long)&(os_00->_fileName).field_2 + 8) = 0;
  os_00[1]._vptr_OStream = (_func_int **)0x0;
  (os_00->_fileName)._M_string_length = 0;
  (os_00->_fileName).field_2._M_allocated_capacity = 0;
  os_00->_vptr_OStream = (_func_int **)0x0;
  *(undefined8 *)&os_00->_fileName = 0;
  *(undefined8 *)&os_00[1]._fileName = 0;
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdd0);
  in_RDI[1]._vptr_GenericOutputFile[0x27] = (_func_int *)os_00;
  *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x28) = 0;
  Header::sanityCheck(in_stack_00001a60,(bool)in_stack_00001a5f,(bool)in_stack_00001a5e);
  *(undefined8 *)(in_RDI[1]._vptr_GenericOutputFile[0x27] + 0x28) = in_RSI;
  *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 7) = 0;
  initialize((OutputFile *)in_stack_fffffffffffffe40,header_00);
  lineOffsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x27] + 0x28) + 0x18))();
  *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
   (in_RDI[1]._vptr_GenericOutputFile[0x27] + 0x30) = lineOffsets;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Header *)in_stack_fffffffffffffdd0
            );
  p_Var1 = (_func_int *)Header::writeTo(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  in_RDI[1]._vptr_GenericOutputFile[8] = p_Var1;
  p_Var1 = (_func_int *)anon_unknown_6::writeLineOffsets(os_00,lineOffsets);
  in_RDI[1]._vptr_GenericOutputFile[0x20] = p_Var1;
  return;
}

Assistant:

OutputFile::OutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    int                                      numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = false;
    try
    {
        header.sanityCheck ();
        _data->_streamData->os = &os;
        _data->multiPart       = false;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (
            *_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
            writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData) delete _data->_streamData;
            delete _data;
        }

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << os.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData) delete _data->_streamData;
            delete _data;
        }

        throw;
    }
}